

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Control.cpp
# Opt level: O2

void __thiscall Control::loop(undefined8 param_1,GameData *Data,int param_3)

{
  bool flagGameOver;
  int iVar1;
  bool flagQuit;
  Draw local_ad;
  GameOperator local_ac;
  undefined1 local_a8 [120];
  
  local_ac.statusNum = param_3;
  GameData::InitNewGame(Data);
  flagGameOver = false;
  flagQuit = false;
  do {
    GameData::GameData((GameData *)local_a8,Data);
    Draw::PrintUi(&local_ad,(GameData *)local_a8,flagQuit,flagGameOver);
    std::__cxx11::string::~string((string *)(local_a8 + 0x50));
    if (flagGameOver == false) {
      iVar1 = GameOperator::GetMoveNumber(&local_ac);
      if (flagQuit == false) {
        flagQuit = iVar1 == 5;
        if (0xfffffffc < iVar1 - 8U) goto LAB_001024df;
        GameOperator::Move(&local_ac,Data,iVar1);
        flagGameOver = GameData::IsGameOver(Data);
        if (Data->IsMove == true) {
          GameData::MakeNewNumber(Data);
        }
      }
      else {
        while (iVar1 - 8U < 0xfffffffe) {
          iVar1 = GameOperator::GetMoveNumber(&local_ac);
        }
        if (iVar1 == 6) {
          return;
        }
        flagGameOver = false;
        flagQuit = false;
      }
    }
    else {
      do {
        iVar1 = GameOperator::GetMoveNumber(&local_ac);
      } while (iVar1 - 8U < 0xfffffffe);
      if (iVar1 != 6) {
        return;
      }
      GameData::InitNewGame(Data);
LAB_001024df:
      flagGameOver = false;
    }
    Draw::ClearScreen(&local_ad);
  } while( true );
}

Assistant:

void Control::loop(GameData Data, Draw DrawUi, GameOperator Operator) {
    bool flagQuit = false;
    bool flagGameOver = false;
    Data.InitNewGame();
    while (true) {
        DrawUi.PrintUi(Data, flagQuit, flagGameOver);

        int Tempop;
        if (flagGameOver) {
            Tempop = Operator.GetMoveNumber();
            while (Tempop != YES && Tempop != NO)
                Tempop = Operator.GetMoveNumber();
            if (Tempop == YES) {
                Data.InitNewGame();
                flagGameOver = false;
            } else
                break;
        }

        else if (flagQuit) {
            Tempop = Operator.GetMoveNumber();
            while (Tempop != YES && Tempop != NO)
                Tempop = Operator.GetMoveNumber();
            if (Tempop == YES)
                break;
            else
                flagQuit = false;
        }

        else
        {
            Tempop = Operator.GetMoveNumber();

            if (Tempop == QUIT)
                flagQuit = true;

            if (Tempop != NO && Tempop != YES && Tempop != QUIT) {
                Operator.Move(Data, Tempop);
                if (Data.IsGameOver())
                    flagGameOver = true;
                if(Data.IsMove)
                    Data.MakeNewNumber();
            }
        }

        DrawUi.ClearScreen();
    }
}